

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_copy_string(char *src,ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t sVar1;
  char *in_RDI;
  char *dst;
  size_t sz;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    local_8 = (char *)ma_malloc(in_stack_ffffffffffffffd8,(ma_allocation_callbacks *)0x200003);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      ma_strcpy_s(local_8,sVar1 + 1,in_RDI);
    }
  }
  return local_8;
}

Assistant:

MA_API MA_NO_INLINE char* ma_copy_string(const char* src, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t sz;
    char* dst;

    if (src == NULL) {
        return NULL;
    }

    sz = strlen(src)+1;
    dst = (char*)ma_malloc(sz, pAllocationCallbacks);
    if (dst == NULL) {
        return NULL;
    }

    ma_strcpy_s(dst, sz, src);

    return dst;
}